

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O2

int If_LogCreateAndXorMulti(Vec_Int_t *vAig,int *pFaninLits,int nFanins,int nSuppAll,int fXor)

{
  int iVar1;
  ulong uVar2;
  
  for (uVar2 = (ulong)(uint)nFanins; 1 < (int)uVar2; uVar2 = uVar2 - 1) {
    iVar1 = If_LogCreateAndXor(vAig,pFaninLits[uVar2 - 1],pFaninLits[uVar2 - 2],nSuppAll,fXor);
    pFaninLits[uVar2 - 2] = iVar1;
  }
  return *pFaninLits;
}

Assistant:

static inline int If_LogCreateAndXorMulti( Vec_Int_t * vAig, int * pFaninLits, int nFanins, int nSuppAll, int fXor )
{
    int i;
    assert( nFanins > 0 );
    for ( i = nFanins - 1; i > 0; i-- )
        pFaninLits[i-1] = If_LogCreateAndXor( vAig, pFaninLits[i], pFaninLits[i-1], nSuppAll, fXor );
    return pFaninLits[0];
}